

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractWrittenFont.cpp
# Opt level: O0

void __thiscall AbstractWrittenFont::~AbstractWrittenFont(AbstractWrittenFont *this)

{
  code *pcVar1;
  AbstractWrittenFont *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

AbstractWrittenFont::~AbstractWrittenFont(void)
{
	delete mCIDRepresentation;
	delete mANSIRepresentation;
}